

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlparser.cpp
# Opt level: O2

void __thiscall UrlParserTest::http_url_with_username::test_method(http_url_with_username *this)

{
  undefined1 local_308 [8];
  UrlParser parser;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  string local_78;
  uint16_t local_52;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "http://username@www.example.com/dir/subdir?param=1&param=2;param%20=%20#fragment",
             (allocator<char> *)&local_78);
  httpparser::UrlParser::UrlParser((UrlParser *)local_308,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  parser.url._256_8_ = anon_var_dwarf_9ec8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&parser.url.integerPort,0x2a);
  local_50._M_string_length._0_1_ = 0;
  local_50._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_50.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_50.field_2._8_8_ = (long)"\"\"" + 2;
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_1d0 = "";
  local_78._M_dataplus._M_p._0_4_ = CONCAT31(local_78._M_dataplus._M_p._1_3_,local_308[0]);
  local_52 = CONCAT11(local_52._1_1_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_50,&local_1d8,0x2a,1,2,&local_78,"parser.isValid()",&local_52,"true");
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_1c0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0x2b);
  local_50._M_string_length._0_1_ = 0;
  local_50._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_50.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_50.field_2._8_8_ = (long)"\"\"" + 2;
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_e0 = "";
  httpparser::UrlParser::scheme_abi_cxx11_(&local_78,(UrlParser *)local_308);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (&local_50,&local_e8,0x2b,1,2,&local_78,"parser.scheme()","http","\"http\"");
  std::__cxx11::string::~string((string *)&local_78);
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_1a0 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a8,0x2c);
  local_50._M_string_length._0_1_ = 0;
  local_50._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_50.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_50.field_2._8_8_ = (long)"\"\"" + 2;
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_d0 = "";
  httpparser::UrlParser::username_abi_cxx11_(&local_78,(UrlParser *)local_308);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[9]>
            (&local_50,&local_d8,0x2c,1,2,&local_78,"parser.username()","username","\"username\"");
  std::__cxx11::string::~string((string *)&local_78);
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_180 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_188,0x2d);
  local_50._M_string_length._0_1_ = 0;
  local_50._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_50.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_50.field_2._8_8_ = (long)"\"\"" + 2;
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_c0 = "";
  httpparser::UrlParser::hostname_abi_cxx11_(&local_78,(UrlParser *)local_308);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[16]>
            (&local_50,&local_c8,0x2d,1,2,&local_78,"parser.hostname()","www.example.com",
             "\"www.example.com\"");
  std::__cxx11::string::~string((string *)&local_78);
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_160 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_168,0x2e);
  local_50._M_string_length._0_1_ = 0;
  local_50._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_50.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_50.field_2._8_8_ = (long)"\"\"" + 2;
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_b0 = "";
  httpparser::UrlParser::path_abi_cxx11_(&local_78,(UrlParser *)local_308);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[12]>
            (&local_50,&local_b8,0x2e,1,2,&local_78,"parser.path()","/dir/subdir","\"/dir/subdir\"")
  ;
  std::__cxx11::string::~string((string *)&local_78);
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_140 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0x2f);
  local_50._M_string_length._0_1_ = 0;
  local_50._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_50.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_50.field_2._8_8_ = (long)"\"\"" + 2;
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_a0 = "";
  httpparser::UrlParser::query_abi_cxx11_(&local_78,(UrlParser *)local_308);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[29]>
            (&local_50,&local_a8,0x2f,1,2,&local_78,"parser.query()","param=1&param=2;param%20=%20",
             "\"param=1&param=2;param%20=%20\"");
  std::__cxx11::string::~string((string *)&local_78);
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_120 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_128,0x30);
  local_50._M_string_length._0_1_ = 0;
  local_50._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_50.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_50.field_2._8_8_ = (long)"\"\"" + 2;
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_90 = "";
  httpparser::UrlParser::fragment_abi_cxx11_(&local_78,(UrlParser *)local_308);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[9]>
            (&local_50,&local_98,0x30,1,2,&local_78,"parser.fragment()","fragment","\"fragment\"");
  std::__cxx11::string::~string((string *)&local_78);
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_100 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_108,0x31);
  local_50._M_string_length._0_1_ = 0;
  local_50._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00116958;
  local_50.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_50.field_2._8_8_ = (long)"\"\"" + 2;
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_80 = "";
  local_52 = httpparser::UrlParser::httpPort((UrlParser *)local_308);
  local_78._M_dataplus._M_p._0_4_ = 0x50;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,int>
            (&local_50,&local_88,0x31,1,2,&local_52,"parser.httpPort()",&local_78,"80");
  httpparser::UrlParser::Url::~Url((Url *)&parser);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(http_url_with_username)
{
    const char *text = "http://username@www.example.com/dir/subdir?param=1&param=2;param%20=%20#fragment";
    UrlParser parser(text);

    BOOST_CHECK_EQUAL(parser.isValid(), true);
    BOOST_CHECK_EQUAL(parser.scheme(), "http");
    BOOST_CHECK_EQUAL(parser.username(), "username");
    BOOST_CHECK_EQUAL(parser.hostname(), "www.example.com");
    BOOST_CHECK_EQUAL(parser.path(), "/dir/subdir");
    BOOST_CHECK_EQUAL(parser.query(), "param=1&param=2;param%20=%20");
    BOOST_CHECK_EQUAL(parser.fragment(), "fragment");
    BOOST_CHECK_EQUAL(parser.httpPort(), 80);
}